

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

EraseResult __thiscall
QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
::erase(QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
        *this,const_iterator first,const_iterator last)

{
  _Rb_tree_header *__position;
  Map *this_00;
  iterator iVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  EraseResult EVar4;
  _Alloc_node local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  EVar4.data = (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
                *)operator_new(0x38);
  ((EVar4.data)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 0;
  __position = &((EVar4.data)->m)._M_t._M_impl.super__Rb_tree_header;
  ((EVar4.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ((EVar4.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ((EVar4.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  ((EVar4.data)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  ((EVar4.data)->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &(EVar4.data)->m;
  p_Var2 = (this->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1._M_node = &__position->_M_header;
  if (p_Var2 != first._M_node) {
    do {
      local_40._M_t = &this_00->_M_t;
      iVar1 = std::
              _Rb_tree<QFontDef,std::pair<QFontDef_const,QFontEngineData*>,std::_Select1st<std::pair<QFontDef_const,QFontEngineData*>>,std::less<QFontDef>,std::allocator<std::pair<QFontDef_const,QFontEngineData*>>>
              ::
              _M_insert_unique_<std::pair<QFontDef_const,QFontEngineData*>const&,std::_Rb_tree<QFontDef,std::pair<QFontDef_const,QFontEngineData*>,std::_Select1st<std::pair<QFontDef_const,QFontEngineData*>>,std::less<QFontDef>,std::allocator<std::pair<QFontDef_const,QFontEngineData*>>>::_Alloc_node>
                        ((_Rb_tree<QFontDef,std::pair<QFontDef_const,QFontEngineData*>,std::_Select1st<std::pair<QFontDef_const,QFontEngineData*>>,std::less<QFontDef>,std::allocator<std::pair<QFontDef_const,QFontEngineData*>>>
                          *)this_00,(const_iterator)__position,
                         (pair<const_QFontDef,_QFontEngineData_*> *)(p_Var2 + 1),&local_40);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != first._M_node);
  }
  p_Var3 = &(this->m)._M_t._M_impl.super__Rb_tree_header;
  for (; p_Var2 != last._M_node; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
  }
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      local_40._M_t = &this_00->_M_t;
      std::
      _Rb_tree<QFontDef,std::pair<QFontDef_const,QFontEngineData*>,std::_Select1st<std::pair<QFontDef_const,QFontEngineData*>>,std::less<QFontDef>,std::allocator<std::pair<QFontDef_const,QFontEngineData*>>>
      ::
      _M_insert_unique_<std::pair<QFontDef_const,QFontEngineData*>const&,std::_Rb_tree<QFontDef,std::pair<QFontDef_const,QFontEngineData*>,std::_Select1st<std::pair<QFontDef_const,QFontEngineData*>>,std::less<QFontDef>,std::allocator<std::pair<QFontDef_const,QFontEngineData*>>>::_Alloc_node>
                ((_Rb_tree<QFontDef,std::pair<QFontDef_const,QFontEngineData*>,std::_Select1st<std::pair<QFontDef_const,QFontEngineData*>>,std::less<QFontDef>,std::allocator<std::pair<QFontDef_const,QFontEngineData*>>>
                  *)this_00,(const_iterator)__position,
                 (pair<const_QFontDef,_QFontEngineData_*> *)(p_Var2 + 1),&local_40);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  if ((_Rb_tree_header *)iVar1._M_node != __position) {
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    EVar4.it._M_node = iVar1._M_node;
    return EVar4;
  }
  __stack_chk_fail();
}

Assistant:

EraseResult erase(const_iterator first, const_iterator last) const
    {
        EraseResult result;
        result.data = new QMapData;
        result.it = result.data->m.end();
        const auto newDataEnd = result.it;

        auto i = m.begin();
        const auto e = m.end();

        // copy over all the elements before first
        while (i != first) {
            result.it = result.data->m.insert(newDataEnd, *i);
            ++i;
        }

        // skip until last
        while (i != last)
            ++i;

        // copy from last to the end
        while (i != e) {
            result.data->m.insert(newDataEnd, *i);
            ++i;
        }

        if (result.it != newDataEnd)
            ++result.it;

        return result;
    }